

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O1

bool __thiscall
ftxui::anon_unknown_5::ResizableSplitRightBase::OnEvent(ResizableSplitRightBase *this,Event *event)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer psVar2;
  size_type sVar3;
  CapturedMouseInterface *pCVar4;
  undefined8 uVar5;
  bool bVar6;
  CapturedMouseInterface *pCVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iStack_d4;
  Motion MStack_d0;
  undefined4 uStack_cc;
  int local_c8;
  int iStack_c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  ScreenInteractive *local_a0;
  undefined1 local_98 [24];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ScreenInteractive *local_60;
  Event local_58;
  
  paVar1 = &(event->input_).field_2;
  if (event->type_ != Mouse) {
    local_58.field_1._12_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
    paVar8 = &local_58.input_.field_2;
    local_58._0_8_ = *(undefined8 *)event;
    local_58.field_1._4_8_ = *(undefined8 *)((long)&event->field_1 + 4);
    local_58.input_._M_dataplus._M_p = (event->input_)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.input_._M_dataplus._M_p == paVar1) {
      local_58.input_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_58.input_.field_2._8_8_ = *(undefined8 *)((long)&(event->input_).field_2 + 8);
      local_58.input_._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_58.input_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_58.input_._M_string_length = (event->input_)._M_string_length;
    (event->input_)._M_dataplus._M_p = (pointer)paVar1;
    (event->input_)._M_string_length = 0;
    (event->input_).field_2._M_local_buf[0] = '\0';
    local_58.screen_ = event->screen_;
    bVar6 = ComponentBase::OnEvent(&this->super_ComponentBase,&local_58);
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_58.input_._M_dataplus._M_p;
    goto LAB_00143cb3;
  }
  psVar2 = *(pointer *)((long)&event->field_1 + 0xc);
  paVar8 = &local_b0;
  pCVar4 = *(CapturedMouseInterface **)event;
  uVar5 = *(undefined8 *)((long)&event->field_1 + 4);
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(event->input_)._M_dataplus._M_p;
  if (local_c0 == paVar1) {
    local_b0._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0._8_8_ = *(undefined8 *)((long)&(event->input_).field_2 + 8);
    local_c0 = paVar8;
  }
  else {
    local_b0._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  sVar3 = (event->input_)._M_string_length;
  (event->input_)._M_dataplus._M_p = (pointer)paVar1;
  (event->input_)._M_string_length = 0;
  (event->input_).field_2._M_local_buf[0] = '\0';
  local_a0 = event->screen_;
  pCVar7 = (this->captured_mouse_)._M_t.
           super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
           .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
  MStack_d0 = (Motion)uVar5;
  if ((pCVar7 == (CapturedMouseInterface *)0x0) || (MStack_d0 != Released)) {
    iStack_d4 = (int)((ulong)pCVar4 >> 0x20);
    local_c8 = (int)psVar2;
    if ((iStack_d4 == 0) && (MStack_d0 == Pressed)) {
      iStack_c4 = (int)((ulong)psVar2 >> 0x20);
      bVar6 = Box::Contain(&this->separator_box_,local_c8,iStack_c4);
      if (bVar6 && (this->captured_mouse_)._M_t.
                   super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
                   .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl ==
                   (CapturedMouseInterface *)0x0) {
        ComponentBase::CaptureMouse((ComponentBase *)local_98,(Event *)this);
        uVar5 = local_98._0_8_;
        local_98._0_8_ = (CapturedMouseInterface *)0x0;
        pCVar4 = (this->captured_mouse_)._M_t.
                 super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
                 .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl;
        (this->captured_mouse_)._M_t.
        super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
        .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
             (CapturedMouseInterface *)uVar5;
        if (pCVar4 != (CapturedMouseInterface *)0x0) {
          (*pCVar4->_vptr_CapturedMouseInterface[1])();
        }
        pCVar7 = (CapturedMouseInterface *)local_98._0_8_;
        if ((CapturedMouseInterface *)local_98._0_8_ != (CapturedMouseInterface *)0x0)
        goto LAB_00143bd1;
        goto LAB_00143cac;
      }
    }
    if ((this->captured_mouse_)._M_t.
        super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
        .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl ==
        (CapturedMouseInterface *)0x0) {
      uStack_cc = (undefined4)((ulong)uVar5 >> 0x20);
      local_98._8_4_ = MStack_d0;
      local_98._12_4_ = uStack_cc;
      local_98._0_8_ = pCVar4;
      local_98._16_8_ = psVar2;
      local_80._M_p = (pointer)&local_70;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_c0,sVar3 + (long)local_c0)
      ;
      local_60 = local_a0;
      bVar6 = ComponentBase::OnEvent(&this->super_ComponentBase,(Event *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_p != &local_70) {
        operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
      }
      goto LAB_00143cb3;
    }
    *this->main_size_ = (this->global_box_).x_max - local_c8;
  }
  else {
    (this->captured_mouse_)._M_t.
    super___uniq_ptr_impl<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_ftxui::CapturedMouseInterface_*,_std::default_delete<ftxui::CapturedMouseInterface>_>
    .super__Head_base<0UL,_ftxui::CapturedMouseInterface_*,_false>._M_head_impl =
         (CapturedMouseInterface *)0x0;
LAB_00143bd1:
    (*pCVar7->_vptr_CapturedMouseInterface[1])();
  }
LAB_00143cac:
  bVar6 = true;
LAB_00143cb3:
  if (local_c0 != paVar8) {
    operator_delete(local_c0,paVar8->_M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool OnEvent(Event event) final {
    if (event.is_mouse())
      return OnMouseEvent(std::move(event));
    return ComponentBase::OnEvent(std::move(event));
  }